

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::ExpandRegistryValues(string *source,KeyWOW64 param_2)

{
  bool bVar1;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string reg;
  string val;
  RegularExpression regEntry;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  long *local_160 [2];
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  RegularExpression local_100;
  
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"\\[(HKEY[^]]*)\\]");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find(&local_100,(source->_M_dataplus)._M_p);
    if (!bVar1) break;
    if (local_100.startp[1] == (char *)0x0) {
      local_180 = &local_170;
      local_178 = 0;
      local_170 = 0;
    }
    else {
      local_180 = &local_170;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,local_100.startp[1],local_100.endp[1]);
    }
    local_118 = 0;
    local_110 = 0;
    local_140[0] = local_130;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"[","");
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char*>((string *)local_160,local_180,local_180 + local_178);
    std::__cxx11::string::append((char *)local_160);
    std::__cxx11::string::_M_append((char *)local_140,(ulong)local_160[0]);
    if (local_160[0] != local_150) {
      operator_delete(local_160[0],local_150[0] + 1);
    }
    cmsys::SystemTools::ReplaceString(source,(char *)local_140[0],"/registry");
    if (local_140[0] != local_130) {
      operator_delete(local_140[0],local_130[0] + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
    }
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source, KeyWOW64)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source))
    {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string val;
    std::string reg = "[";
    reg += key + "]";
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
    }

}